

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

uchar * create_bmp(uchar *data,int W,int H,int *return_size)

{
  uchar *puVar1;
  int local_5c;
  uchar *puStack_58;
  int x;
  uchar *p;
  uchar *s_1;
  uchar *puStack_40;
  int y;
  uchar *c;
  uchar *b;
  int local_28;
  int fs;
  int s;
  int R;
  int *return_size_local;
  int H_local;
  int W_local;
  uchar *data_local;
  
  fs = ((W * 3 + 3) / 4) * 4;
  local_28 = H * fs;
  b._4_4_ = local_28 + 0x36;
  _s = return_size;
  return_size_local._0_4_ = H;
  return_size_local._4_4_ = W;
  _H_local = data;
  c = (uchar *)operator_new__((long)b._4_4_);
  *c = 'B';
  puStack_40 = c + 2;
  c[1] = 'M';
  write_int(&stack0xffffffffffffffc0,b._4_4_);
  write_int(&stack0xffffffffffffffc0,0);
  write_int(&stack0xffffffffffffffc0,0x36);
  write_int(&stack0xffffffffffffffc0,0x28);
  write_int(&stack0xffffffffffffffc0,return_size_local._4_4_);
  write_int(&stack0xffffffffffffffc0,(int)return_size_local);
  write_short(&stack0xffffffffffffffc0,1);
  write_short(&stack0xffffffffffffffc0,0x18);
  write_int(&stack0xffffffffffffffc0,0);
  write_int(&stack0xffffffffffffffc0,local_28);
  write_int(&stack0xffffffffffffffc0,0);
  write_int(&stack0xffffffffffffffc0,0);
  write_int(&stack0xffffffffffffffc0,0);
  write_int(&stack0xffffffffffffffc0,0);
  _H_local = _H_local + return_size_local._4_4_ * 3 * (int)return_size_local;
  for (s_1._4_4_ = 0; s_1._4_4_ < (int)return_size_local; s_1._4_4_ = s_1._4_4_ + 1) {
    _H_local = _H_local + -(long)(return_size_local._4_4_ * 3);
    puStack_58 = puStack_40;
    p = _H_local;
    for (local_5c = 0; local_5c < return_size_local._4_4_; local_5c = local_5c + 1) {
      *puStack_58 = p[2];
      puVar1 = puStack_58 + 2;
      puStack_58[1] = p[1];
      puStack_58 = puStack_58 + 3;
      *puVar1 = *p;
      p = p + 3;
    }
    puStack_40 = puStack_40 + fs;
  }
  *_s = b._4_4_;
  return c;
}

Assistant:

static unsigned char *create_bmp(const unsigned char *data, int W, int H, int *return_size){
  int R=(3*W+3)/4 * 4; // the number of bytes per row, rounded up to multiple of 4
  int s=H*R;
  int fs=14+40+s;
  unsigned char *b=new unsigned char[fs];
  unsigned char *c=b;
  // BMP header
  *c++='B';
  *c++='M';
  write_int(&c,fs);
  write_int(&c,0);
  write_int(&c,14+40);
  // DIB header:
  write_int(&c,40);
  write_int(&c,W);
  write_int(&c,H);
  write_short(&c,1);
  write_short(&c,24);//bits ber pixel
  write_int(&c,0);//RGB
  write_int(&c,s);
  write_int(&c,0);// horizontal resolution
  write_int(&c,0);// vertical resolution
  write_int(&c,0);//number of colors. 0 -> 1<<bits_per_pixel
  write_int(&c,0);
  // Pixel data
  data+=3*W*H;
  for (int y=0;y<H;++y){
    data-=3*W;
    const unsigned char *s=data;
    unsigned char *p=c;
    for (int x=0;x<W;++x){
      *p++=s[2];
      *p++=s[1];
      *p++=s[0];
      s+=3;
    }
    c+=R;
  }
  *return_size = fs;
  return b;
}